

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O2

void usage(void)

{
  fwrite("rdjpgcom displays any textual comments in a JPEG file.\n",0x37,1,_stderr);
  fprintf(_stderr,"Usage: %s [switches] [inputfile]\n",progname);
  fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
  fwrite("  -raw        Display non-printable characters in comments (unsafe)\n",0x44,1,_stderr);
  fwrite("  -verbose    Also display dimensions of JPEG image\n",0x34,1,_stderr);
  exit(1);
}

Assistant:

static void
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "rdjpgcom displays any textual comments in a JPEG file.\n");

  fprintf(stderr, "Usage: %s [switches] [inputfile]\n", progname);

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -raw        Display non-printable characters in comments (unsafe)\n");
  fprintf(stderr, "  -verbose    Also display dimensions of JPEG image\n");

  exit(EXIT_FAILURE);
}